

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_block.c
# Opt level: O2

void sig_unblock(int sig)

{
  sigset_t ss;
  
  sigemptyset((sigset_t *)&ss);
  sigaddset((sigset_t *)&ss,sig);
  sigprocmask(1,(sigset_t *)&ss,(sigset_t *)0x0);
  return;
}

Assistant:

void sig_unblock(int sig)
{
#ifdef HASSIGPROCMASK
  sigset_t ss;
  sigemptyset(&ss);
  sigaddset(&ss,sig);
  sigprocmask(SIG_UNBLOCK,&ss,(sigset_t *) 0);
#else
  sigsetmask(sigsetmask(~0) & ~(1 << (sig - 1)));
#endif
}